

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_Vx_annotation.cpp
# Opt level: O1

void __thiscall
ON_OBSOLETE_V5_Annotation::Internal_InitializeFromV2Annotation
          (ON_OBSOLETE_V5_Annotation *this,ON_OBSOLETE_V2_Annotation *V2_annotation,
          ON_3dmAnnotationContext *annotation_context)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  wchar_t *text_value;
  V5_TextDisplayMode VVar5;
  long lVar6;
  int iVar7;
  ON_wString *src;
  ON_Plane *pOVar8;
  ON_Plane *pOVar9;
  ON_Plane *this_00;
  uint uVar10;
  byte bVar11;
  ON_2dVector OVar12;
  ON_2dPoint OVar13;
  ON_wString text;
  ON_2dVector v;
  ON_2dPoint v5_point;
  ON_2dPoint V2_point;
  ON_wString local_e0;
  ON_2dVector local_d8;
  ON_2dPoint local_c8;
  ON_3dmAnnotationContext *local_b8;
  ON_Plane local_b0;
  
  bVar11 = 0;
  if (annotation_context == (ON_3dmAnnotationContext *)0x0) {
    annotation_context = &ON_3dmAnnotationContext::Default;
  }
  local_b8 = annotation_context;
  SetTextFormula(this,(wchar_t *)0x0);
  bVar1 = ON_wString::IsNotEmpty(&V2_annotation->m_usertext);
  src = &V2_annotation->m_defaulttext;
  if (bVar1) {
    src = &V2_annotation->m_usertext;
  }
  ON_wString::ON_wString(&local_e0,src);
  ON_wString::TrimLeftAndRight(&local_e0,(wchar_t *)0x0);
  text_value = ON_wString::operator_cast_to_wchar_t_(&local_e0);
  SetTextValue(this,text_value);
  uVar3 = ON_OBSOLETE_V2_Annotation::PointCount(V2_annotation);
  if (((int)uVar3 < 1) ||
     (bVar1 = ON_2dPoint::IsValid((V2_annotation->m_points).m_a),
     !bVar1 || V2_annotation->m_type == dtDimAngular)) {
    local_d8.x = ON_2dVector::ZeroVector.x;
    local_d8.y = ON_2dVector::ZeroVector.y;
  }
  else {
    OVar12 = ON_2dPoint::operator-(&ON_2dPoint::Origin,(V2_annotation->m_points).m_a);
    local_d8.y = OVar12.y;
    local_d8.x = OVar12.x;
  }
  uVar10 = (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_capacity;
  if (-1 < (int)uVar10) {
    (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count = 0;
  }
  if (uVar10 < uVar3) {
    ON_SimpleArray<ON_2dPoint>::SetCapacity
              (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,(long)(int)uVar3);
  }
  if (0 < (int)uVar3) {
    ON_SimpleArray<ON_2dPoint>::Append
              (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,&ON_2dPoint::Origin);
  }
  if (1 < (int)uVar3) {
    uVar10 = 1;
    do {
      OVar13 = ON_OBSOLETE_V2_Annotation::Point(V2_annotation,uVar10);
      local_b0.origin.y = OVar13.y;
      local_b0.origin.x = OVar13.x;
      bVar1 = ON_2dPoint::IsValid((ON_2dPoint *)&local_b0);
      if (bVar1) {
        OVar13 = ON_2dPoint::operator+((ON_2dPoint *)&local_b0,&local_d8);
        local_c8.y = OVar13.y;
        local_c8.x = OVar13.x;
      }
      else {
        local_c8.x = local_b0.origin.x;
        local_c8.y = local_b0.origin.y;
      }
      SetPoint(this,uVar10,&local_c8);
      uVar10 = uVar10 + 1;
    } while (uVar3 != uVar10);
  }
  ON_OBSOLETE_V2_Annotation::Plane(&local_b0,V2_annotation);
  this_00 = &this->m_plane;
  pOVar8 = &local_b0;
  pOVar9 = this_00;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pOVar9->origin).x = (pOVar8->origin).x;
    pOVar8 = (ON_Plane *)((long)pOVar8 + (ulong)bVar11 * -0x10 + 8);
    pOVar9 = (ON_Plane *)((long)pOVar9 + (ulong)bVar11 * -0x10 + 8);
  }
  ON_Plane::~ON_Plane(&local_b0);
  ON_Plane::UpdateEquation(this_00);
  bVar1 = ON_Plane::IsValid(this_00);
  if (bVar1) {
    bVar1 = ON_2dVector::IsNotZero(&local_d8);
    if (bVar1) {
      ON_Plane::PointAt(&local_b0.origin,this_00,-local_d8.x,-local_d8.y);
      (this->m_plane).origin.z = local_b0.origin.z;
      (this_00->origin).x = local_b0.origin.x;
      (this->m_plane).origin.y = local_b0.origin.y;
      ON_Plane::UpdateEquation(this_00);
    }
  }
  else {
    pOVar8 = &ON_Plane::World_xy;
    for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
      (this_00->origin).x = (pOVar8->origin).x;
      pOVar8 = (ON_Plane *)((long)pOVar8 + ((ulong)bVar11 * -2 + 1) * 8);
      this_00 = (ON_Plane *)((long)this_00 + (ulong)bVar11 * -0x10 + 8);
    }
  }
  this->m_textheight = 1.0;
  bVar11 = 1;
  iVar4 = -1;
  switch(V2_annotation->m_type) {
  default:
    this->m_textdisplaymode = kNormal;
  case dtTextBlock:
  case dtDimOrdinate:
    bVar2 = false;
LAB_004bc010:
    VVar5 = kNormal;
    bVar1 = false;
    iVar7 = -1;
    break;
  case dtDimLinear:
  case dtDimAligned:
    iVar7 = 5;
    bVar1 = true;
    VVar5 = kAboveLine;
    bVar2 = false;
    bVar11 = 0;
    iVar4 = 5;
    break;
  case dtDimAngular:
    bVar2 = ON_OBSOLETE_V2_Annotation::UserPositionedText(V2_annotation);
    iVar4 = 3;
    iVar7 = 2;
    bVar1 = true;
    VVar5 = kAboveLine;
    bVar11 = 0;
    break;
  case dtDimDiameter:
  case dtDimRadius:
    bVar2 = ON_OBSOLETE_V2_Annotation::UserPositionedText(V2_annotation);
    goto LAB_004bc010;
  case dtLeader:
    iVar7 = 2;
    bVar1 = true;
    VVar5 = kInLine;
    bVar2 = false;
    bVar11 = 1;
  }
  this->m_textdisplaymode = VVar5;
  this->m_userpositionedtext = bVar2;
  if (((bool)(iVar4 < iVar7 | bVar11)) ||
     ((this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count <= iVar4)) {
    if ((bVar1) &&
       (((this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count < iVar7 &&
        (-1 < (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_capacity)))) {
      (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count = 0;
    }
  }
  else if (!(bool)(bVar11 | (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_capacity < iVar4)) {
    (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count = iVar4;
  }
  iVar4 = ON_3dmAnnotationContext::V5_ArchiveDimStyleIndex(local_b8);
  SetV5_3dmArchiveDimStyleIndex(this,iVar4);
  ON_wString::~ON_wString(&local_e0);
  return;
}

Assistant:

void ON_OBSOLETE_V5_Annotation::Internal_InitializeFromV2Annotation(
  const class ON_OBSOLETE_V2_Annotation& V2_annotation,
  const class ON_3dmAnnotationContext* annotation_context
)
{
  if (nullptr == annotation_context)
    annotation_context = &ON_3dmAnnotationContext::Default;

  //const ON_3dmAnnotationSettings& annotation_settings = annotation_context->AnnotationSettings();

  SetTextFormula(nullptr);

  ON_wString text
    = (V2_annotation.m_usertext.IsNotEmpty())
    ? V2_annotation.m_usertext
    : V2_annotation.m_defaulttext;
  text.TrimLeftAndRight();

  SetTextValue(text);

  // 30 Oct 2013 - Lowell - changed to copy the number of points in V2_annotation.PointCount() instead of always 5
  const int V2_point_count = V2_annotation.PointCount();
  const ON_2dVector v
    = (V2_point_count > 0 && V2_annotation.m_points[0].IsValid() && ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular != V2_annotation.m_type)
    ? (ON_2dPoint::Origin - V2_annotation.m_points[0])
    : ON_2dVector::ZeroVector;

  m_points.SetCount(0);
  m_points.Reserve(V2_point_count);
  if (V2_point_count > 0)
    m_points.Append(ON_2dPoint::Origin);
  for (int i = 1; i < V2_point_count; i++)
  {
    const ON_2dPoint V2_point = V2_annotation.Point(i);
    ON_2dPoint v5_point
      = V2_point.IsValid()
      ? V2_point + v
      : V2_point;
    SetPoint(i, v5_point);
  }

  m_plane = V2_annotation.Plane();
  m_plane.UpdateEquation();
  if (false == m_plane.IsValid())
    m_plane = ON_Plane::World_xy;
  else if (v.IsNotZero())
  {
    m_plane.origin = m_plane.PointAt(-v.x, -v.y);
    m_plane.UpdateEquation();
  }

  m_textheight = 1.0;

  ON_INTERNAL_OBSOLETE::V5_TextDisplayMode text_display_mode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kNormal;
  bool bUserPositionedText = false;
  int min_point_count = -1;
  int max_point_count = -1;

  switch (V2_annotation.m_type)
  {
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtNothing:
    m_textdisplaymode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kNormal;
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned:
    text_display_mode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine;
    min_point_count = ON_OBSOLETE_V5_DimLinear::dim_pt_count;
    max_point_count = ON_OBSOLETE_V5_DimLinear::dim_pt_count;
    break;
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular:
    bUserPositionedText = V2_annotation.UserPositionedText() ? true : false;
    text_display_mode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine;
    min_point_count = 2;
    max_point_count = 3;
    break;
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter:
    bUserPositionedText = V2_annotation.UserPositionedText() ? true : false;
    break;
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius:
    bUserPositionedText = V2_annotation.UserPositionedText() ? true : false;
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtLeader:
    bUserPositionedText = false;
    text_display_mode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kInLine;
    min_point_count = 2;
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock:
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate:
    break;

  default:
    m_textdisplaymode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kNormal;
    break;
  }

  m_textdisplaymode = text_display_mode;
  m_userpositionedtext = bUserPositionedText;

  if (max_point_count > 0 && max_point_count >= min_point_count && m_points.Count() > max_point_count)
    m_points.SetCount(max_point_count);
  else if (min_point_count >= 0 && m_points.Count() < min_point_count)
    m_points.SetCount(0);

  SetV5_3dmArchiveDimStyleIndex(annotation_context->V5_ArchiveDimStyleIndex());
}